

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O3

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          btTransform *transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  aphy_size aVar15;
  aphy_pointer pvVar16;
  aphy_pointer pvVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  pvVar16 = accessor->vertices;
  pvVar17 = accessor->indices;
  uVar12 = accessor->index_count;
  if (accessor->index_stride == 4) {
    if (2 < uVar12) {
      uVar13 = accessor->index_offset;
      lVar23 = 0;
      do {
        uVar14 = accessor->vertex_offset;
        aVar15 = accessor->vertex_stride;
        uVar24 = (ulong)(*(int *)((long)pvVar17 + lVar23 + (ulong)uVar13) * aVar15);
        uVar22 = (ulong)(*(int *)((long)pvVar17 + lVar23 + (ulong)uVar13 + 4) * aVar15);
        uVar21 = (ulong)(aVar15 * *(int *)((long)pvVar17 + lVar23 + (ulong)uVar13 + 8));
        fVar1 = *(float *)((long)pvVar16 + uVar24 + uVar14);
        fVar2 = *(float *)((long)pvVar16 + uVar24 + 4 + (ulong)uVar14);
        fVar3 = *(float *)((long)pvVar16 + uVar24 + 8 + (ulong)uVar14);
        fVar18 = (transform->m_basis).m_el[0].m_floats[0];
        fVar19 = (transform->m_basis).m_el[0].m_floats[1];
        fVar20 = (transform->m_basis).m_el[0].m_floats[2];
        fVar4 = (transform->m_basis).m_el[2].m_floats[0];
        fVar5 = (transform->m_basis).m_el[2].m_floats[1];
        fVar6 = (transform->m_basis).m_el[2].m_floats[2];
        fVar7 = (transform->m_basis).m_el[1].m_floats[1];
        fVar8 = (transform->m_basis).m_el[1].m_floats[0];
        fVar9 = (transform->m_basis).m_el[1].m_floats[2];
        uVar11 = *(undefined8 *)(transform->m_origin).m_floats;
        fVar25 = (float)uVar11;
        fVar26 = (float)((ulong)uVar11 >> 0x20);
        fVar10 = (transform->m_origin).m_floats[2];
        local_40.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
        local_40.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
        local_40.m_floats[2] = fVar3 * fVar6 + fVar1 * fVar4 + fVar2 * fVar5 + fVar10;
        local_40.m_floats[3] = 0.0;
        fVar1 = *(float *)((long)pvVar16 + uVar22 + uVar14);
        fVar2 = *(float *)((long)pvVar16 + uVar22 + 4 + (ulong)uVar14);
        fVar3 = *(float *)((long)pvVar16 + uVar22 + 8 + (ulong)uVar14);
        local_50.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
        local_50.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
        local_50.m_floats[2] = fVar3 * fVar6 + fVar1 * fVar4 + fVar5 * fVar2 + fVar10;
        local_50.m_floats[3] = 0.0;
        fVar1 = *(float *)((long)pvVar16 + uVar21 + uVar14);
        fVar2 = *(float *)((long)pvVar16 + uVar21 + 4 + (ulong)uVar14);
        fVar3 = *(float *)((long)pvVar16 + uVar21 + 8 + (ulong)uVar14);
        local_60.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
        local_60.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
        local_60.m_floats[2] = fVar6 * fVar3 + fVar4 * fVar1 + fVar5 * fVar2 + fVar10;
        local_60.m_floats[3] = 0.0;
        btTriangleMesh::addTriangle(&this->triangleMeshData,&local_40,&local_50,&local_60,false);
        lVar23 = lVar23 + 0xc;
      } while (((ulong)uVar12 / 3) * 0xc != lVar23);
    }
  }
  else if ((accessor->index_stride == 2) && (2 < uVar12)) {
    uVar13 = accessor->index_offset;
    lVar23 = 0;
    do {
      uVar14 = accessor->vertex_offset;
      aVar15 = accessor->vertex_stride;
      uVar24 = (ulong)(*(ushort *)((long)pvVar17 + lVar23 + (ulong)uVar13) * aVar15);
      uVar22 = (ulong)(*(ushort *)((long)pvVar17 + lVar23 + (ulong)uVar13 + 2) * aVar15);
      uVar21 = (ulong)(*(ushort *)((long)pvVar17 + lVar23 + (ulong)uVar13 + 4) * aVar15);
      fVar1 = *(float *)((long)pvVar16 + uVar24 + uVar14);
      fVar2 = *(float *)((long)pvVar16 + uVar24 + 4 + (ulong)uVar14);
      fVar3 = *(float *)((long)pvVar16 + uVar24 + 8 + (ulong)uVar14);
      fVar18 = (transform->m_basis).m_el[0].m_floats[0];
      fVar19 = (transform->m_basis).m_el[0].m_floats[1];
      fVar20 = (transform->m_basis).m_el[0].m_floats[2];
      fVar4 = (transform->m_basis).m_el[2].m_floats[0];
      fVar5 = (transform->m_basis).m_el[2].m_floats[1];
      fVar6 = (transform->m_basis).m_el[2].m_floats[2];
      fVar7 = (transform->m_basis).m_el[1].m_floats[1];
      fVar8 = (transform->m_basis).m_el[1].m_floats[0];
      fVar9 = (transform->m_basis).m_el[1].m_floats[2];
      uVar11 = *(undefined8 *)(transform->m_origin).m_floats;
      fVar25 = (float)uVar11;
      fVar26 = (float)((ulong)uVar11 >> 0x20);
      fVar10 = (transform->m_origin).m_floats[2];
      local_40.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
      local_40.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
      local_40.m_floats[2] = fVar3 * fVar6 + fVar1 * fVar4 + fVar2 * fVar5 + fVar10;
      local_40.m_floats[3] = 0.0;
      fVar1 = *(float *)((long)pvVar16 + uVar22 + uVar14);
      fVar2 = *(float *)((long)pvVar16 + uVar22 + 4 + (ulong)uVar14);
      fVar3 = *(float *)((long)pvVar16 + uVar22 + 8 + (ulong)uVar14);
      local_50.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
      local_50.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
      local_50.m_floats[2] = fVar3 * fVar6 + fVar1 * fVar4 + fVar5 * fVar2 + fVar10;
      local_50.m_floats[3] = 0.0;
      fVar1 = *(float *)((long)pvVar16 + uVar21 + uVar14);
      fVar2 = *(float *)((long)pvVar16 + uVar21 + 4 + (ulong)uVar14);
      fVar3 = *(float *)((long)pvVar16 + uVar21 + 8 + (ulong)uVar14);
      local_60.m_floats[1] = fVar3 * fVar9 + fVar1 * fVar8 + fVar2 * fVar7 + fVar26;
      local_60.m_floats[0] = fVar3 * fVar20 + fVar1 * fVar18 + fVar2 * fVar19 + fVar25;
      local_60.m_floats[2] = fVar6 * fVar3 + fVar4 * fVar1 + fVar5 * fVar2 + fVar10;
      local_60.m_floats[3] = 0.0;
      btTriangleMesh::addTriangle(&this->triangleMeshData,&local_40,&local_50,&local_60,false);
      lVar23 = lVar23 + 6;
    } while ((ulong)((uVar12 / 3) * 2) * 3 != lVar23);
  }
  return APHY_OK;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform(aphy_collision_mesh_accessor* accessor, const btTransform &transform)
{
    auto rawIndices = reinterpret_cast<const uint8_t*> (accessor->indices);
    auto rawVertices = reinterpret_cast<const uint8_t*> (accessor->vertices);
    size_t triangleCount = accessor->index_count / 3;
    if(accessor->index_stride == 2)
    {
        auto indices = reinterpret_cast<const uint16_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }

    }
    else if(accessor->index_stride == 4)
    {
        auto indices = reinterpret_cast<const uint32_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }
    }

    return APHY_OK;
}